

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

matrix4f * __thiscall tinyusdz::value::matrix4f::operator=(matrix4f *this,matrix4d *src)

{
  double *pdVar1;
  matrix4f *pmVar2;
  size_t j;
  long lVar3;
  long lVar4;
  
  pmVar2 = this;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      pdVar1 = *(double (*) [4])*(double (*) [4])src + lVar4;
      *(ulong *)(*(float (*) [4])*(float (*) [4])this + lVar4) =
           CONCAT44((float)pdVar1[1],(float)*pdVar1);
      lVar4 = lVar4 + 2;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    src = (matrix4d *)((long)src + 0x20);
    this = (matrix4f *)((long)this + 0x10);
  } while (lVar3 != 4);
  return pmVar2;
}

Assistant:

matrix4f &matrix4f::operator=(const matrix4d &src) {

  for (size_t j = 0; j < 4; j++) {
    for (size_t i = 0; i < 4; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}